

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O2

XSerializable * xercesc_4_0::DatatypeValidatorFactory::createObject(MemoryManager *manager)

{
  DatatypeValidatorFactory *this;
  
  this = (DatatypeValidatorFactory *)XMemory::operator_new(0x18,manager);
  DatatypeValidatorFactory(this,manager);
  return &this->super_XSerializable;
}

Assistant:

void DatatypeValidatorFactory::serialize(XSerializeEngine& serEng)
{

    // Need not to serialize static data member, fBuiltInRegistry

    if (serEng.isStoring())
    {
        /***
         * Serialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::storeObject(fUserDefinedRegistry, serEng);
    }
    else
    {
        /***
         * Deserialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::loadObject(&fUserDefinedRegistry, 29, true, serEng);
    }

}